

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shared-validator.cc
# Opt level: O2

Result __thiscall
wabt::SharedValidator::OnSimdStoreLane
          (SharedValidator *this,Location *loc,Opcode opcode,Var *memidx,Address alignment,
          uint64_t value)

{
  Result RVar1;
  Result RVar2;
  Result RVar3;
  Result RVar4;
  Address natural_alignment;
  MemoryType mt;
  Opcode local_ac;
  Address local_a8;
  uint64_t local_a0;
  Limits local_98;
  Var local_78;
  
  local_ac.enum_ = opcode.enum_;
  local_a8 = alignment;
  local_a0 = value;
  RVar1 = CheckInstr(this,opcode,loc);
  local_98.initial = 0;
  local_98.max._0_7_ = 0;
  local_98._15_4_ = 0;
  Var::Var(&local_78,memidx);
  RVar2 = CheckMemoryIndex(this,&local_78,(MemoryType *)&local_98);
  Var::~Var(&local_78);
  natural_alignment = Opcode::GetMemorySize(&local_ac);
  RVar3 = CheckAlign(this,loc,local_a8,natural_alignment);
  RVar4 = TypeChecker::OnSimdStoreLane(&this->typechecker_,local_ac,&local_98,local_a0);
  RVar1.enum_._0_1_ =
       RVar4.enum_ == Error ||
       (RVar3.enum_ == Error || (RVar2.enum_ == Error || RVar1.enum_ == Error));
  RVar1.enum_._1_3_ = 0;
  return (Result)RVar1.enum_;
}

Assistant:

Result SharedValidator::OnSimdStoreLane(const Location& loc,
                                        Opcode opcode,
                                        Var memidx,
                                        Address alignment,
                                        uint64_t value) {
  Result result = CheckInstr(opcode, loc);
  MemoryType mt;
  result |= CheckMemoryIndex(memidx, &mt);
  result |= CheckAlign(loc, alignment, opcode.GetMemorySize());
  result |= typechecker_.OnSimdStoreLane(opcode, mt.limits, value);
  return result;
}